

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QTextEdit::ExtraSelection>::moveAppend
          (QGenericArrayOps<QTextEdit::ExtraSelection> *this,ExtraSelection *b,ExtraSelection *e)

{
  ExtraSelection *pEVar1;
  long lVar2;
  
  if ((b != e) && (b < e)) {
    pEVar1 = (this->super_QArrayDataPointer<QTextEdit::ExtraSelection>).ptr;
    lVar2 = (this->super_QArrayDataPointer<QTextEdit::ExtraSelection>).size;
    do {
      QTextCursor::QTextCursor(&pEVar1[lVar2].cursor,&b->cursor);
      QTextFormat::QTextFormat
                (&pEVar1[lVar2].format.super_QTextFormat,&(b->format).super_QTextFormat);
      lVar2 = (this->super_QArrayDataPointer<QTextEdit::ExtraSelection>).size + 1;
      (this->super_QArrayDataPointer<QTextEdit::ExtraSelection>).size = lVar2;
      b = b + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }